

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineDefinitions
               (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                *subroutineUniforms,GLenum shader,ostringstream *ret)

{
  int iVar1;
  pointer pSVar2;
  long lVar3;
  _func_int *p_Var4;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t fn;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                             "uniform float zero;");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  uVar10 = 0;
  do {
    pSVar2 = (subroutineUniforms->
             super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(subroutineUniforms->
                       super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x168) <=
        uVar10) {
      return;
    }
    bVar5 = DefOccurence::occurs(&pSVar2[uVar10].defOccurence,shader);
    if (bVar5) {
      poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                               "subroutine vec4 ");
      poVar7 = std::operator<<(poVar7,(string *)
                                      &(subroutineUniforms->
                                       super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10].functions.
                                       typeName);
      poVar7 = std::operator<<(poVar7,"(float param);");
      std::endl<char,std::char_traits<char>>(poVar7);
      lVar11 = 0xe8;
      uVar9 = 0;
      while( true ) {
        pSVar2 = (subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar3 = *(long *)&pSVar2[uVar10].functions.fn.
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
        ;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pSVar2[uVar10].functions.fn.
                                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                            + 8) - lVar3) / 0x108) <= uVar9) break;
        if (-1 < *(int *)(lVar3 + -0xe8 + lVar11)) {
          bVar5 = DefOccurence::occurs((DefOccurence *)(lVar11 + -0xe0 + lVar3),shader);
          if (bVar5) {
            std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                            "layout(index = ");
            iVar1 = *(int *)(lVar3 + -0xe4 + lVar11);
            uVar6 = 0x40;
            pcVar8 = "0";
            if (iVar1 == 1) {
LAB_00bdebde:
              p_Var4 = (ret->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
                       [-3];
              *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                       (long)p_Var4) =
                   *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                            (long)p_Var4) & 0xffffffb5 | uVar6;
              std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
            }
            else if (iVar1 == 2) {
              uVar6 = 8;
              pcVar8 = "0x";
              goto LAB_00bdebde;
            }
            poVar7 = (ostream *)std::ostream::operator<<(ret,*(int *)(lVar3 + -0xe8 + lVar11));
            *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
                 *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5
                 | 2;
            std::operator<<(poVar7,") ");
          }
        }
        poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "subroutine(");
        poVar7 = std::operator<<(poVar7,(string *)
                                        &(subroutineUniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                         functions.typeName);
        poVar7 = std::operator<<(poVar7,") vec4 ");
        poVar7 = std::operator<<(poVar7,(string *)
                                        (*(long *)&(subroutineUniforms->
                                                                                                      
                                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar10]
                                                  .functions.fn.
                                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                        + lVar11));
        std::operator<<(poVar7,"(float param) { return zero + ");
        UniformValue::streamValue
                  ((UniformValue *)
                   (*(long *)&(subroutineUniforms->
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar10].functions.fn.
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                    + lVar11 + -0xd8),ret,0,0);
        poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"; }");
        std::endl<char,std::char_traits<char>>(poVar7);
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x108;
      }
      LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                (&pSVar2[uVar10].location,ret,shader);
      poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                               "subroutine uniform ");
      poVar7 = std::operator<<(poVar7,(string *)
                                      &(subroutineUniforms->
                                       super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10].functions.
                                       typeName);
      poVar7 = std::operator<<(poVar7," ");
      std::operator<<(poVar7,(string *)
                             &(subroutineUniforms->
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar10].name);
      SubroutineUniform::streamArrayStr
                ((subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar10,ret,-1);
      poVar7 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static void streamSubroutineDefinitions(const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
											std::ostringstream& ret)
	{
		if (subroutineUniforms.size())
		{
			//add a "zero" uniform;
			ret << "uniform float zero;" << std::endl;
		}

		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			if (subroutineUniforms[i].defOccurence.occurs(shader))
			{

				//subroutine vec4 st0(float param);
				ret << "subroutine vec4 " << subroutineUniforms[i].functions.getTypeName() << "(float param);"
					<< std::endl;

				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					//layout(index = X) subroutine(st0) vec4 sf0(float param) { .... };
					subroutineUniforms[i].functions.fn[fn].index.streamDefinition(ret, shader);
					ret << "subroutine(" << subroutineUniforms[i].functions.getTypeName() << ") vec4 "
						<< subroutineUniforms[i].functions.fn[fn].getName() << "(float param) { return zero + ";
					subroutineUniforms[i].functions.fn[fn].getRetVal().streamValue(ret);
					ret << "; }" << std::endl;
				}

				//layout(location = X) subroutine uniform stX uX[...];
				subroutineUniforms[i].location.streamDefinition(ret, shader);
				ret << "subroutine uniform " << subroutineUniforms[i].functions.getTypeName() << " "
					<< subroutineUniforms[i].getName();
				subroutineUniforms[i].streamArrayStr(ret);
				ret << ";" << std::endl;
			}
		}
	}